

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolve.cpp
# Opt level: O3

void assessExcessiveBoundCost(HighsLogOptions *log_options,HighsModel *model)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  double dVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined8 local_c8;
  undefined8 local_b8;
  uint local_88;
  uint uStack_84;
  uint local_38;
  uint uStack_34;
  
  lVar3 = (long)(model->lp_).num_col_;
  dVar13 = INFINITY;
  dVar16 = -INFINITY;
  dVar15 = -INFINITY;
  dVar14 = dVar13;
  if (0 < lVar3) {
    dVar13 = INFINITY;
    dVar15 = -INFINITY;
    lVar7 = 0;
    dVar16 = -INFINITY;
    dVar14 = INFINITY;
    do {
      dVar10 = (model->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      dVar9 = ABS(dVar10);
      if ((long)dVar9 - 1U < 0xfffffffffffff ||
          (uint)((ulong)((long)dVar9 + -0x10000000000000) >> 0x35) < 0x3ff) {
        dVar10 = ABS(dVar10);
        if (dVar10 <= dVar14) {
          dVar14 = dVar10;
        }
        if (dVar16 <= dVar10) {
          dVar16 = dVar10;
        }
      }
      dVar10 = (model->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      dVar9 = ABS(dVar10);
      if ((long)dVar9 - 1U < 0xfffffffffffff ||
          (uint)((ulong)((long)dVar9 + -0x10000000000000) >> 0x35) < 0x3ff) {
        dVar10 = ABS(dVar10);
        if (dVar10 <= dVar13) {
          dVar13 = dVar10;
        }
        if (dVar15 <= dVar10) {
          dVar15 = dVar10;
        }
      }
      dVar10 = (model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      dVar9 = ABS(dVar10);
      if ((long)dVar9 - 1U < 0xfffffffffffff ||
          (uint)((ulong)((long)dVar9 + -0x10000000000000) >> 0x35) < 0x3ff) {
        dVar10 = ABS(dVar10);
        if (dVar10 <= dVar13) {
          dVar13 = dVar10;
        }
        if (dVar15 <= dVar10) {
          dVar15 = dVar10;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar3 != lVar7);
  }
  lVar3 = (long)(model->lp_).num_row_;
  dVar10 = INFINITY;
  dVar9 = -INFINITY;
  if (0 < lVar3) {
    dVar10 = INFINITY;
    dVar9 = -INFINITY;
    lVar7 = 0;
    do {
      dVar11 = (model->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      dVar8 = ABS(dVar11);
      if ((long)dVar8 - 1U < 0xfffffffffffff ||
          (uint)((ulong)((long)dVar8 + -0x10000000000000) >> 0x35) < 0x3ff) {
        dVar11 = ABS(dVar11);
        if (dVar11 <= dVar10) {
          dVar10 = dVar11;
        }
        if (dVar9 <= dVar11) {
          dVar9 = dVar11;
        }
      }
      dVar11 = (model->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      dVar8 = ABS(dVar11);
      if ((long)dVar8 - 1U < 0xfffffffffffff ||
          (uint)((ulong)((long)dVar8 + -0x10000000000000) >> 0x35) < 0x3ff) {
        dVar11 = ABS(dVar11);
        if (dVar11 <= dVar10) {
          dVar10 = dVar11;
        }
        if (dVar9 <= dVar11) {
          dVar9 = dVar11;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar3 != lVar7);
  }
  uVar2 = HighsSparseMatrix::numNz(&(model->lp_).a_matrix_);
  dVar11 = INFINITY;
  if (0 < (int)uVar2) {
    dVar11 = INFINITY;
    dVar8 = -INFINITY;
    uVar5 = 0;
    do {
      dVar12 = (model->lp_).a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar5];
      dVar6 = ABS(dVar12);
      if ((long)dVar6 - 1U < 0xfffffffffffff ||
          (uint)((ulong)((long)dVar6 + -0x10000000000000) >> 0x35) < 0x3ff) {
        dVar12 = ABS(dVar12);
        if (dVar12 <= dVar11) {
          dVar11 = dVar12;
        }
        if (dVar8 <= dVar12) {
          dVar8 = dVar12;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  local_c8._0_4_ = (uint)-(ulong)(dVar16 <= -INFINITY);
  local_c8._4_4_ = (uint)(-(ulong)(dVar16 <= -INFINITY) >> 0x20);
  local_38 = SUB84(dVar16,0);
  uStack_34 = (uint)((ulong)dVar16 >> 0x20);
  local_c8 = (double)CONCAT44(~local_c8._4_4_ & uStack_34,~(uint)local_c8 & local_38);
  local_b8._0_4_ = (uint)-(ulong)(dVar15 <= -INFINITY);
  local_b8._4_4_ = (uint)(-(ulong)(dVar15 <= -INFINITY) >> 0x20);
  local_88 = SUB84(dVar15,0);
  uStack_84 = (uint)((ulong)dVar15 >> 0x20);
  local_b8 = (double)CONCAT44(~local_b8._4_4_ & uStack_84,~(uint)local_b8 & local_88);
  highsLogUser(log_options,kInfo,"Coefficient ranges:\n");
  if (uVar2 != 0) {
    highsLogUser(log_options,kInfo,"  Matrix [%5.0e, %5.0e]\n",dVar11);
  }
  dVar9 = (double)(~-(ulong)(dVar9 <= -INFINITY) & (ulong)dVar9);
  if ((model->lp_).num_col_ != 0) {
    highsLogUser(log_options,kInfo,"  Cost   [%5.0e, %5.0e]\n",
                 ~-(ulong)(INFINITY <= dVar14) & (ulong)dVar14);
    highsLogUser(log_options,kInfo,"  Bound  [%5.0e, %5.0e]\n",
                 ~-(ulong)(INFINITY <= dVar13) & (ulong)dVar13);
  }
  if ((model->lp_).num_row_ != 0) {
    highsLogUser(log_options,kInfo,"  RHS    [%5.0e, %5.0e]\n",
                 ~-(ulong)(INFINITY <= dVar10) & (ulong)dVar10);
  }
  if (10000000000.0 < local_c8) {
    dVar15 = ldexp(1.0,(model->lp_).user_cost_scale_);
    dVar15 = 10000000000.0 / (local_c8 / dVar15);
    dVar16 = log2(dVar15);
    dVar16 = floor(dVar16);
    dVar15 = log10(dVar15);
    dVar15 = floor(dVar15);
    pcVar4 = "User-scaled problem";
    if ((model->lp_).user_cost_scale_ == 0) {
      pcVar4 = "Problem";
    }
    highsLogUser(log_options,kWarning,
                 "%s has excessively large costs: consider scaling the costs by 1e%+1d or less, or setting option user_cost_scale to %d or less\n"
                 ,pcVar4,(ulong)(uint)-(int)dVar15,(ulong)(uint)(int)dVar16);
  }
  if (10000000000.0 < local_b8) {
    dVar15 = ldexp(1.0,(model->lp_).user_bound_scale_);
    dVar15 = 10000000000.0 / (local_b8 / dVar15);
    dVar16 = log2(dVar15);
    dVar15 = log10(dVar15);
    dVar15 = floor(dVar15);
    bVar1 = HighsLp::isMip(&model->lp_);
    if (bVar1) {
      pcVar4 = "User-scaled problem";
      if ((model->lp_).user_bound_scale_ == 0) {
        pcVar4 = "Problem";
      }
      highsLogUser(log_options,kWarning,
                   "%s has excessively large bounds: consider scaling the bounds by 1e%+1d or less\n"
                   ,pcVar4,(ulong)(uint)-(int)dVar15);
    }
    else {
      dVar16 = floor(dVar16);
      pcVar4 = "User-scaled problem";
      if ((model->lp_).user_bound_scale_ == 0) {
        pcVar4 = "Problem";
      }
      highsLogUser(log_options,kWarning,
                   "%s has excessively large bounds: consider scaling the bounds by 1e%+1d or less, or setting option user_bound_scale to %d or less\n"
                   ,pcVar4,(ulong)(uint)-(int)dVar15,(ulong)(uint)(int)dVar16);
    }
  }
  if (10000000000.0 < dVar9) {
    dVar15 = ldexp(1.0,(model->lp_).user_bound_scale_);
    dVar15 = 10000000000.0 / (dVar9 / dVar15);
    dVar16 = log2(dVar15);
    dVar15 = log10(dVar15);
    dVar15 = floor(dVar15);
    bVar1 = HighsLp::isMip(&model->lp_);
    if (bVar1) {
      pcVar4 = "User-scaled problem";
      if ((model->lp_).user_bound_scale_ == 0) {
        pcVar4 = "Problem";
      }
      highsLogUser(log_options,kWarning,
                   "%s has excessively large bounds: consider scaling the bounds by 1e%+1d or less\n"
                   ,pcVar4,(ulong)(uint)-(int)dVar15);
    }
    else {
      dVar16 = floor(dVar16);
      pcVar4 = "User-scaled problem";
      if ((model->lp_).user_bound_scale_ == 0) {
        pcVar4 = "Problem";
      }
      highsLogUser(log_options,kWarning,
                   "%s has excessively large bounds: consider scaling the bounds by 1e%+1d or less, or setting option user_bound_scale to %d or less\n"
                   ,pcVar4,(ulong)(uint)-(int)dVar15,(ulong)(uint)(int)dVar16);
    }
  }
  if ((0.0 < local_c8) && (local_c8 < 0.0001)) {
    dVar15 = ldexp(1.0,(model->lp_).user_cost_scale_);
    dVar15 = 0.0001 / (local_c8 / dVar15);
    dVar16 = log2(dVar15);
    dVar16 = ceil(dVar16);
    dVar15 = log10(dVar15);
    dVar15 = ceil(dVar15);
    pcVar4 = "User-scaled problem";
    if ((model->lp_).user_cost_scale_ == 0) {
      pcVar4 = "Problem";
    }
    highsLogUser(log_options,kWarning,
                 "%s has excessively small costs: consider scaling the costs up by 1e%+1d or more, or setting option user_cost_scale to %d or more\n"
                 ,pcVar4,(ulong)(uint)(int)dVar15,(ulong)(uint)(int)dVar16);
  }
  if ((0.0 < local_b8) && (local_b8 < 0.0001)) {
    dVar15 = ldexp(1.0,(model->lp_).user_bound_scale_);
    dVar15 = 0.0001 / (local_b8 / dVar15);
    dVar16 = log2(dVar15);
    dVar15 = log10(dVar15);
    dVar15 = ceil(dVar15);
    bVar1 = HighsLp::isMip(&model->lp_);
    if (bVar1) {
      pcVar4 = "User-scaled problem";
      if ((model->lp_).user_bound_scale_ == 0) {
        pcVar4 = "Problem";
      }
      highsLogUser(log_options,kWarning,
                   "%s has excessively small bounds: consider scaling the bounds by 1e%+1d or more\n"
                   ,pcVar4,(ulong)(uint)(int)dVar15);
    }
    else {
      dVar16 = ceil(dVar16);
      pcVar4 = "User-scaled problem";
      if ((model->lp_).user_bound_scale_ == 0) {
        pcVar4 = "Problem";
      }
      highsLogUser(log_options,kWarning,
                   "%s has excessively small bounds: consider scaling the bounds by 1e%+1d or more, or setting option user_bound_scale to %d or more\n"
                   ,pcVar4,(ulong)(uint)(int)dVar15,(ulong)(uint)(int)dVar16);
    }
  }
  if ((0.0 < dVar9) && (dVar9 < 0.0001)) {
    dVar15 = ldexp(1.0,(model->lp_).user_bound_scale_);
    dVar15 = 0.0001 / (dVar9 / dVar15);
    dVar16 = log2(dVar15);
    dVar15 = log10(dVar15);
    dVar15 = ceil(dVar15);
    bVar1 = HighsLp::isMip(&model->lp_);
    if (bVar1) {
      pcVar4 = "User-scaled problem";
      if ((model->lp_).user_bound_scale_ == 0) {
        pcVar4 = "Problem";
      }
      highsLogUser(log_options,kWarning,
                   "%s has excessively small bounds: consider scaling the bounds by 1e%+1d or more\n"
                   ,pcVar4,(ulong)(uint)(int)dVar15);
      return;
    }
    dVar16 = ceil(dVar16);
    pcVar4 = "User-scaled problem";
    if ((model->lp_).user_bound_scale_ == 0) {
      pcVar4 = "Problem";
    }
    highsLogUser(log_options,kWarning,
                 "%s has excessively small bounds: consider scaling the bounds by 1e%+1d or more, or setting option user_bound_scale to %d or more\n"
                 ,pcVar4,(ulong)(uint)(int)dVar15,(ulong)(uint)(int)dVar16);
    return;
  }
  return;
}

Assistant:

void assessExcessiveBoundCost(const HighsLogOptions log_options,
                              const HighsModel& model) {
  auto assessFiniteNonzero = [&](const double value, double& min_value,
                                 double& max_value) {
    double abs_value = std::abs(value);
    if (abs_value > 0 && abs_value < kHighsInf) {
      min_value = std::min(abs_value, min_value);
      max_value = std::max(abs_value, max_value);
    }
  };
  const HighsLp& lp = model.lp_;
  double min_finite_col_cost = kHighsInf;
  double max_finite_col_cost = -kHighsInf;
  double min_finite_col_bound = kHighsInf;
  double max_finite_col_bound = -kHighsInf;
  double min_finite_row_bound = kHighsInf;
  double max_finite_row_bound = -kHighsInf;
  double min_matrix_value = kHighsInf;
  double max_matrix_value = -kHighsInf;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    assessFiniteNonzero(lp.col_cost_[iCol], min_finite_col_cost,
                        max_finite_col_cost);
    assessFiniteNonzero(lp.col_lower_[iCol], min_finite_col_bound,
                        max_finite_col_bound);
    assessFiniteNonzero(lp.col_upper_[iCol], min_finite_col_bound,
                        max_finite_col_bound);
  }
  if (min_finite_col_cost == kHighsInf) min_finite_col_cost = 0;
  if (max_finite_col_cost == -kHighsInf) max_finite_col_cost = 0;
  if (min_finite_col_bound == kHighsInf) min_finite_col_bound = 0;
  if (max_finite_col_bound == -kHighsInf) max_finite_col_bound = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    assessFiniteNonzero(lp.row_lower_[iRow], min_finite_row_bound,
                        max_finite_row_bound);
    assessFiniteNonzero(lp.row_upper_[iRow], min_finite_row_bound,
                        max_finite_row_bound);
  }
  if (min_finite_row_bound == kHighsInf) min_finite_row_bound = 0;
  if (max_finite_row_bound == -kHighsInf) max_finite_row_bound = 0;
  HighsInt num_nz = lp.a_matrix_.numNz();
  for (HighsInt iEl = 0; iEl < num_nz; iEl++)
    assessFiniteNonzero(lp.a_matrix_.value_[iEl], min_matrix_value,
                        max_matrix_value);

  highsLogUser(log_options, HighsLogType::kInfo, "Coefficient ranges:\n");
  if (num_nz)
    highsLogUser(log_options, HighsLogType::kInfo, "  Matrix [%5.0e, %5.0e]\n",
                 min_matrix_value, max_matrix_value);
  if (lp.num_col_) {
    highsLogUser(log_options, HighsLogType::kInfo, "  Cost   [%5.0e, %5.0e]\n",
                 min_finite_col_cost, max_finite_col_cost);
    highsLogUser(log_options, HighsLogType::kInfo, "  Bound  [%5.0e, %5.0e]\n",
                 min_finite_col_bound, max_finite_col_bound);
  }
  if (lp.num_row_)
    highsLogUser(log_options, HighsLogType::kInfo, "  RHS    [%5.0e, %5.0e]\n",
                 min_finite_row_bound, max_finite_row_bound);

  // LPs with no columns or no finite nonzero costs will have
  // max_finite_col_cost = 0
  assert(max_finite_col_cost >= 0);
  if (max_finite_col_cost > kExcessivelyLargeCostValue) {
    double user_cost_scale_value = std::pow(2, lp.user_cost_scale_);
    // Warn that costs are excessively large, and suggest scaling
    double ratio = kExcessivelyLargeCostValue /
                   (max_finite_col_cost / user_cost_scale_value);
    HighsInt suggested_user_cost_scale_setting = std::floor(std::log2(ratio));
    HighsInt suggested_cost_scale_exponent = std::floor(std::log10(ratio));
    highsLogUser(
        log_options, HighsLogType::kWarning,
        "%s has excessively large costs: consider scaling the costs "
        "by 1e%+1d or less, or setting option user_cost_scale to %d or less\n",
        lp.user_cost_scale_ ? "User-scaled problem" : "Problem",
        int(-suggested_cost_scale_exponent),
        int(suggested_user_cost_scale_setting));
  }
  // LPs with no columns or no finite nonzero bounds will have
  // max_finite_col_bound = 0
  assert(max_finite_col_bound >= 0);
  if (max_finite_col_bound > kExcessivelyLargeBoundValue) {
    double user_bound_scale_value = std::pow(2, lp.user_bound_scale_);
    // Warn that bounds are excessively large, and suggest scaling
    double ratio = kExcessivelyLargeBoundValue /
                   (max_finite_col_bound / user_bound_scale_value);
    HighsInt suggested_user_bound_scale = std::floor(std::log2(ratio));
    HighsInt suggested_bound_scale_exponent = std::floor(std::log10(ratio));
    if (lp.isMip()) {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively large bounds: consider scaling the bounds "
          "by 1e%+1d or less\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(-suggested_bound_scale_exponent));
    } else {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively large bounds: consider scaling the bounds "
          "by 1e%+1d or less, "
          "or setting option user_bound_scale to %d or less\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(-suggested_bound_scale_exponent),
          int(suggested_user_bound_scale));
    }
  }
  // LPs with no rows or no finite nonzero bounds will have
  // max_finite_row_bound = 0
  assert(max_finite_row_bound >= 0);
  if (max_finite_row_bound > kExcessivelyLargeBoundValue) {
    double user_bound_scale_value = std::pow(2, lp.user_bound_scale_);
    // Warn that bounds are excessively large, and suggest scaling
    double ratio = kExcessivelyLargeBoundValue /
                   (max_finite_row_bound / user_bound_scale_value);
    HighsInt suggested_user_bound_scale = std::floor(std::log2(ratio));
    HighsInt suggested_bound_scale_exponent = std::floor(std::log10(ratio));
    if (lp.isMip()) {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively large bounds: consider scaling the bounds "
          "by 1e%+1d or less\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(-suggested_bound_scale_exponent));
    } else {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively large bounds: consider scaling the bounds "
          "by 1e%+1d or less, "
          "or setting option user_bound_scale to %d or less\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(-suggested_bound_scale_exponent),
          int(suggested_user_bound_scale));
    }
  }
  // Now consider warning relating to small maximum costs and bounds
  if (max_finite_col_cost > 0 &&
      max_finite_col_cost < kExcessivelySmallCostValue) {
    double user_cost_scale_value = std::pow(2, lp.user_cost_scale_);
    // Warn that costs are excessively small, and suggest scaling
    double ratio = kExcessivelySmallCostValue /
                   (max_finite_col_cost / user_cost_scale_value);
    HighsInt suggested_user_cost_scale_setting = std::ceil(std::log2(ratio));
    HighsInt suggested_cost_scale_exponent = std::ceil(std::log10(ratio));
    highsLogUser(
        log_options, HighsLogType::kWarning,
        "%s has excessively small costs: consider scaling the costs up "
        "by 1e%+1d or more, "
        "or setting option user_cost_scale to %d or more\n",
        lp.user_cost_scale_ ? "User-scaled problem" : "Problem",
        int(suggested_cost_scale_exponent),
        int(suggested_user_cost_scale_setting));
  }
  if (max_finite_col_bound > 0 &&
      max_finite_col_bound < kExcessivelySmallBoundValue) {
    double user_bound_scale_value = std::pow(2, lp.user_bound_scale_);
    // Warn that bounds are excessively small, and suggest scaling
    double ratio = kExcessivelySmallBoundValue /
                   (max_finite_col_bound / user_bound_scale_value);
    HighsInt suggested_user_bound_scale = std::ceil(std::log2(ratio));
    HighsInt suggested_bound_scale_exponent = std::ceil(std::log10(ratio));
    if (lp.isMip()) {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively small bounds: consider scaling the bounds "
          "by 1e%+1d or more\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(suggested_bound_scale_exponent));
    } else {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively small bounds: consider scaling the bounds "
          "by 1e%+1d or more, "
          "or setting option user_bound_scale to %d or more\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(suggested_bound_scale_exponent), int(suggested_user_bound_scale));
    }
  }
  if (max_finite_row_bound > 0 &&
      max_finite_row_bound < kExcessivelySmallBoundValue) {
    double user_bound_scale_value = std::pow(2, lp.user_bound_scale_);
    // Warn that bounds are excessively small, and suggest scaling
    double ratio = kExcessivelySmallBoundValue /
                   (max_finite_row_bound / user_bound_scale_value);
    HighsInt suggested_user_bound_scale = std::ceil(std::log2(ratio));
    HighsInt suggested_bound_scale_exponent = std::ceil(std::log10(ratio));
    if (lp.isMip()) {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively small bounds: consider scaling the bounds "
          "by 1e%+1d or more\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(suggested_bound_scale_exponent));
    } else {
      highsLogUser(
          log_options, HighsLogType::kWarning,
          "%s has excessively small bounds: consider scaling the bounds "
          "by 1e%+1d or more, "
          "or setting option user_bound_scale to %d or more\n",
          lp.user_bound_scale_ ? "User-scaled problem" : "Problem",
          int(suggested_bound_scale_exponent), int(suggested_user_bound_scale));
    }
  }
}